

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureMipmapTests.cpp
# Opt level: O1

int __thiscall
deqp::gles2::Functional::TextureMipmapTests::init(TextureMipmapTests *this,EVP_PKEY_CTX *ctx)

{
  CoordType coordType;
  char *pcVar1;
  TestContext *pTVar2;
  Context *pCVar3;
  RenderContext *pRVar4;
  ContextInfo *renderCtxInfo;
  _func_int **__s;
  TextureCubeGenMipmapCase *node;
  TestNode *pTVar5;
  size_t sVar6;
  Texture2DMipmapCase *pTVar7;
  long lVar8;
  long lVar9;
  Texture2DGenMipmapCase *this_00;
  TextureCubeMipmapCase *this_01;
  TextureMipmapTests *pTVar10;
  bool bVar11;
  undefined1 auStack_228 [8];
  anon_struct_16_3_5cb0d78b *local_220;
  TextureCubeGenMipmapCase *local_218;
  TextureMipmapTests *local_210;
  anon_struct_16_3_5cb0d78b *local_208;
  TestNode *local_200;
  long *local_1f8;
  long local_1e8 [2];
  long local_1d8;
  TestNode *local_1d0;
  ulong local_1c8;
  TestNode *local_1c0;
  long local_1b8;
  long local_1b0;
  ostringstream name;
  
  local_200 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_200,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"2d",
             "2D Texture Mipmapping");
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"cube",
             "Cube Map Filtering");
  tcu::TestNode::addChild((TestNode *)this,local_200);
  local_1c0 = pTVar5;
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  lVar9 = 0;
  local_210 = this;
  do {
    pTVar10 = local_210;
    pTVar5 = (TestNode *)operator_new(0x70);
    local_1b8 = lVar9;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar5,
               (pTVar10->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               init::coordTypes[lVar9].name,init::coordTypes[lVar9].desc);
    tcu::TestNode::addChild(local_200,pTVar5);
    coordType = init::coordTypes[lVar9].type;
    lVar9 = 0;
    local_1d0 = pTVar5;
    do {
      local_208 = (anon_struct_16_3_5cb0d78b *)(init::minFilterModes + lVar9);
      lVar8 = 0;
      local_1b0 = lVar9;
      do {
        local_218 = (TextureCubeGenMipmapCase *)(init::wrapModes + lVar8);
        local_220 = (anon_struct_16_3_5cb0d78b *)0x0;
        local_1d8 = lVar8;
        do {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
          pcVar1 = local_208->name;
          if (pcVar1 == (char *)0x0) {
            std::ios::clear((int)auStack_228 +
                            (int)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                 _vptr_basic_ostream[-3] + 0x80);
          }
          else {
            sVar6 = strlen(pcVar1);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,pcVar1,sVar6);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,"_",1);
          pcVar1 = *(char **)&local_218->super_TestCase;
          if (pcVar1 == (char *)0x0) {
            std::ios::clear((int)auStack_228 +
                            (int)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                 _vptr_basic_ostream[-3] + 0x80);
          }
          else {
            sVar6 = strlen(pcVar1);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,pcVar1,sVar6);
          }
          pcVar1 = *(char **)((long)&init::tex2DSizes[0].name + (long)local_220);
          if (pcVar1 != (char *)0x0) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,"_",1);
            sVar6 = strlen(pcVar1);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,pcVar1,sVar6);
          }
          pTVar7 = (Texture2DMipmapCase *)operator_new(0x100);
          pTVar2 = (pTVar10->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
          pCVar3 = (pTVar10->super_TestCaseGroup).m_context;
          pRVar4 = pCVar3->m_renderCtx;
          renderCtxInfo = pCVar3->m_contextInfo;
          std::__cxx11::stringbuf::str();
          local_1c8 = (ulong)local_208->format;
          Texture2DMipmapCase::Texture2DMipmapCase
                    (pTVar7,pTVar2,pRVar4,renderCtxInfo,(char *)local_1f8,
                     glcts::fixed_sample_locations_values + 1,coordType,local_208->format,
                     *(deUint32 *)((long)local_218 + 8),*(deUint32 *)((long)local_218 + 8),0x1908,
                     0x1401,*(int *)((long)&init::tex2DSizes[0].width + (long)local_220),
                     *(int *)((long)&init::tex2DSizes[0].height + (long)local_220));
          tcu::TestNode::addChild(local_1d0,(TestNode *)pTVar7);
          if (local_1f8 != local_1e8) {
            operator_delete(local_1f8,local_1e8[0] + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
          std::ios_base::~ios_base
                    ((ios_base *)&name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70
                    );
          pTVar10 = local_210;
        } while ((coordType == COORDTYPE_BASIC) &&
                (lVar9 = (long)local_220 + 0x10,
                bVar11 = local_220 == (anon_struct_16_3_5cb0d78b *)0x0,
                local_220 = (anon_struct_16_3_5cb0d78b *)lVar9, bVar11));
        lVar8 = local_1d8 + 1;
      } while (lVar8 != 3);
      lVar9 = local_1b0 + 1;
    } while (lVar9 != 4);
    lVar9 = local_1b8 + 1;
  } while (lVar9 != 3);
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,
             (pTVar10->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"bias",
             "User-supplied bias value");
  tcu::TestNode::addChild(local_200,pTVar5);
  lVar9 = 0;
  do {
    pTVar7 = (Texture2DMipmapCase *)operator_new(0x100);
    pCVar3 = (local_210->super_TestCaseGroup).m_context;
    Texture2DMipmapCase::Texture2DMipmapCase
              (pTVar7,(local_210->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               pCVar3->m_renderCtx,pCVar3->m_contextInfo,
               *(char **)((long)&init::minFilterModes[0].name + lVar9),
               glcts::fixed_sample_locations_values + 1,COORDTYPE_BASIC_BIAS,
               *(deUint32 *)((long)&init::minFilterModes[0].mode + lVar9),0x2901,0x2901,0x1908,
               0x1401,0x40,0x40);
    tcu::TestNode::addChild(pTVar5,(TestNode *)pTVar7);
    lVar9 = lVar9 + 0x10;
  } while (lVar9 != 0x40);
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,
             (local_210->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "generate","Mipmap generation tests");
  tcu::TestNode::addChild(local_200,pTVar5);
  lVar9 = 0;
  do {
    local_208 = init::formats + lVar9;
    lVar8 = 0;
    local_1d8 = lVar9;
    do {
      local_218 = (TextureCubeGenMipmapCase *)(init::tex2DSizes + lVar8);
      lVar9 = 0;
      local_1d0 = (TestNode *)lVar8;
      do {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
        pcVar1 = local_208->name;
        if (pcVar1 == (char *)0x0) {
          std::ios::clear((int)auStack_228 +
                          (int)name.super_basic_ostream<char,_std::char_traits<char>_>.
                               _vptr_basic_ostream[-3] + 0x80);
        }
        else {
          sVar6 = strlen(pcVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,pcVar1,sVar6);
        }
        __s = (local_218->super_TestCase).super_TestNode._vptr_TestNode;
        if (__s != (_func_int **)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,"_",1);
          sVar6 = strlen((char *)__s);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,(char *)__s,sVar6);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,"_",1);
        pcVar1 = *(char **)((long)&init::genHints[0].name + lVar9);
        if (pcVar1 == (char *)0x0) {
          std::ios::clear((int)auStack_228 +
                          (int)name.super_basic_ostream<char,_std::char_traits<char>_>.
                               _vptr_basic_ostream[-3] + 0x80);
        }
        else {
          sVar6 = strlen(pcVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,pcVar1,sVar6);
        }
        this_00 = (Texture2DGenMipmapCase *)operator_new(0xf0);
        pTVar2 = (local_210->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
        pRVar4 = ((local_210->super_TestCaseGroup).m_context)->m_renderCtx;
        local_220 = (anon_struct_16_3_5cb0d78b *)lVar9;
        std::__cxx11::stringbuf::str();
        local_1c8 = (ulong)local_208->dataType;
        Texture2DGenMipmapCase::Texture2DGenMipmapCase
                  (this_00,pTVar2,pRVar4,(char *)local_1f8,glcts::fixed_sample_locations_values + 1,
                   local_208->format,local_208->dataType,
                   *(deUint32 *)((long)&init::genHints[0].hint + (long)local_220),
                   *(int *)&(local_218->super_TestCase).super_TestNode.m_testCtx,
                   *(int *)((long)&(local_218->super_TestCase).super_TestNode.m_testCtx + 4));
        tcu::TestNode::addChild(pTVar5,(TestNode *)this_00);
        if (local_1f8 != local_1e8) {
          operator_delete(local_1f8,local_1e8[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
        std::ios_base::~ios_base
                  ((ios_base *)&name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
        lVar9 = (long)local_220 + 0x10;
      } while (lVar9 == 0x10);
      lVar8 = (long)local_1d0 + 1;
    } while (local_1d0 == (TestNode *)0x0);
    lVar9 = local_1d8 + 1;
  } while (lVar9 != 8);
  lVar9 = 0;
  do {
    pTVar5 = (TestNode *)operator_new(0x70);
    local_220 = (anon_struct_16_3_5cb0d78b *)lVar9;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar5,
               (local_210->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               init::cubeCoordTypes[lVar9].name,init::cubeCoordTypes[lVar9].desc);
    tcu::TestNode::addChild(local_1c0,pTVar5);
    lVar8 = 0;
    do {
      this_01 = (TextureCubeMipmapCase *)operator_new(0x100);
      pCVar3 = (local_210->super_TestCaseGroup).m_context;
      TextureCubeMipmapCase::TextureCubeMipmapCase
                (this_01,(local_210->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.
                         m_testCtx,pCVar3->m_renderCtx,pCVar3->m_contextInfo,
                 *(char **)((long)&init::minFilterModes[0].name + lVar8),
                 glcts::fixed_sample_locations_values + 1,init::cubeCoordTypes[lVar9].type,
                 *(deUint32 *)((long)&init::minFilterModes[0].mode + lVar8),0x812f,0x812f,0x1908,
                 0x1401,0x40);
      tcu::TestNode::addChild(pTVar5,(TestNode *)this_01);
      lVar8 = lVar8 + 0x10;
    } while (lVar8 != 0x40);
    lVar9 = (long)local_220 + 1;
  } while (lVar9 != 3);
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,
             (local_210->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "generate","Mipmap generation tests");
  tcu::TestNode::addChild(local_1c0,pTVar5);
  local_208 = (anon_struct_16_3_5cb0d78b *)0x0;
  do {
    local_220 = init::formats + (long)local_208;
    lVar9 = 0;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
      pcVar1 = local_220->name;
      if (pcVar1 == (char *)0x0) {
        std::ios::clear((int)auStack_228 +
                        (int)name.super_basic_ostream<char,_std::char_traits<char>_>.
                             _vptr_basic_ostream[-3] + 0x80);
      }
      else {
        sVar6 = strlen(pcVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,pcVar1,sVar6);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,"_",1);
      pcVar1 = *(char **)((long)&init::genHints[0].name + lVar9);
      if (pcVar1 == (char *)0x0) {
        std::ios::clear((int)auStack_228 +
                        (int)name.super_basic_ostream<char,_std::char_traits<char>_>.
                             _vptr_basic_ostream[-3] + 0x80);
      }
      else {
        sVar6 = strlen(pcVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,pcVar1,sVar6);
      }
      local_218 = (TextureCubeGenMipmapCase *)operator_new(0xe8);
      pTVar2 = (local_210->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
      pRVar4 = ((local_210->super_TestCaseGroup).m_context)->m_renderCtx;
      std::__cxx11::stringbuf::str();
      node = local_218;
      TextureCubeGenMipmapCase::TextureCubeGenMipmapCase
                (local_218,pTVar2,pRVar4,(char *)local_1f8,glcts::fixed_sample_locations_values + 1,
                 local_220->format,local_220->dataType,
                 *(deUint32 *)((long)&init::genHints[0].hint + lVar9),0x40);
      tcu::TestNode::addChild(pTVar5,(TestNode *)node);
      if (local_1f8 != local_1e8) {
        operator_delete(local_1f8,local_1e8[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
      std::ios_base::~ios_base
                ((ios_base *)&name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
      lVar9 = lVar9 + 0x10;
    } while (lVar9 == 0x10);
    local_208 = (anon_struct_16_3_5cb0d78b *)((long)local_208 + 1);
  } while (local_208 != (anon_struct_16_3_5cb0d78b *)0x8);
  return 8;
}

Assistant:

void TextureMipmapTests::init (void)
{
	tcu::TestCaseGroup* group2D		= new tcu::TestCaseGroup(m_testCtx, "2d",	"2D Texture Mipmapping");
	tcu::TestCaseGroup*	groupCube	= new tcu::TestCaseGroup(m_testCtx, "cube",	"Cube Map Filtering");
	addChild(group2D);
	addChild(groupCube);

	static const struct
	{
		const char*		name;
		deUint32		mode;
	} wrapModes[] =
	{
		{ "clamp",		GL_CLAMP_TO_EDGE },
		{ "repeat",		GL_REPEAT },
		{ "mirror",		GL_MIRRORED_REPEAT }
	};

	static const struct
	{
		const char*		name;
		deUint32		mode;
	} minFilterModes[] =
	{
		{ "nearest_nearest",	GL_NEAREST_MIPMAP_NEAREST	},
		{ "linear_nearest",		GL_LINEAR_MIPMAP_NEAREST	},
		{ "nearest_linear",		GL_NEAREST_MIPMAP_LINEAR	},
		{ "linear_linear",		GL_LINEAR_MIPMAP_LINEAR		}
	};

	static const struct
	{
		CoordType		type;
		const char*		name;
		const char*		desc;
	} coordTypes[] =
	{
		{ COORDTYPE_BASIC,		"basic",		"Mipmapping with translated and scaled coordinates" },
		{ COORDTYPE_AFFINE,		"affine",		"Mipmapping with affine coordinate transform"		},
		{ COORDTYPE_PROJECTED,	"projected",	"Mipmapping with perspective projection"			}
	};

	static const struct
	{
		const char*		name;
		deUint32		format;
		deUint32		dataType;
	} formats[] =
	{
		{ "a8",			GL_ALPHA,			GL_UNSIGNED_BYTE },
		{ "l8",			GL_LUMINANCE,		GL_UNSIGNED_BYTE },
		{ "la88",		GL_LUMINANCE_ALPHA,	GL_UNSIGNED_BYTE },
		{ "rgb565",		GL_RGB,				GL_UNSIGNED_SHORT_5_6_5 },
		{ "rgb888",		GL_RGB,				GL_UNSIGNED_BYTE },
		{ "rgba4444",	GL_RGBA,			GL_UNSIGNED_SHORT_4_4_4_4 },
		{ "rgba5551",	GL_RGBA,			GL_UNSIGNED_SHORT_5_5_5_1 },
		{ "rgba8888",	GL_RGBA,			GL_UNSIGNED_BYTE }
	};

	static const struct
	{
		const char*		name;
		deUint32		hint;
	} genHints[] =
	{
		{ "fastest",	GL_FASTEST },
		{ "nicest",		GL_NICEST }
	};

	static const struct
	{
		const char*		name;
		int				width;
		int				height;
	} tex2DSizes[] =
	{
		{ DE_NULL,		64, 64 }, // Default.
		{ "non_square",	32, 64 }
	};

	// 2D cases.
	for (int coordType = 0; coordType < DE_LENGTH_OF_ARRAY(coordTypes); coordType++)
	{
		tcu::TestCaseGroup* coordTypeGroup = new tcu::TestCaseGroup(m_testCtx, coordTypes[coordType].name, coordTypes[coordType].desc);
		group2D->addChild(coordTypeGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
		{
			for (int wrapMode = 0; wrapMode < DE_LENGTH_OF_ARRAY(wrapModes); wrapMode++)
			{
				// Add non_square variants to basic cases only.
				int sizeEnd = coordTypes[coordType].type == COORDTYPE_BASIC ? DE_LENGTH_OF_ARRAY(tex2DSizes) : 1;

				for (int size = 0; size < sizeEnd; size++)
				{
					std::ostringstream name;
					name << minFilterModes[minFilter].name
						 << "_" << wrapModes[wrapMode].name;

					if (tex2DSizes[size].name)
						name << "_" << tex2DSizes[size].name;

					coordTypeGroup->addChild(new Texture2DMipmapCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(),
																	 name.str().c_str(), "",
																	 coordTypes[coordType].type,
																	 minFilterModes[minFilter].mode,
																	 wrapModes[wrapMode].mode,
																	 wrapModes[wrapMode].mode,
																	 GL_RGBA, GL_UNSIGNED_BYTE,
																	 tex2DSizes[size].width, tex2DSizes[size].height));
				}
			}
		}
	}

	// 2D bias variants.
	{
		tcu::TestCaseGroup* biasGroup = new tcu::TestCaseGroup(m_testCtx, "bias", "User-supplied bias value");
		group2D->addChild(biasGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			biasGroup->addChild(new Texture2DMipmapCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(),
														minFilterModes[minFilter].name, "",
														COORDTYPE_BASIC_BIAS,
														minFilterModes[minFilter].mode,
														GL_REPEAT, GL_REPEAT,
														GL_RGBA, GL_UNSIGNED_BYTE,
														tex2DSizes[0].width, tex2DSizes[0].height));
	}

	// 2D mipmap generation variants.
	{
		tcu::TestCaseGroup* genMipmapGroup = new tcu::TestCaseGroup(m_testCtx, "generate", "Mipmap generation tests");
		group2D->addChild(genMipmapGroup);

		for (int format = 0; format < DE_LENGTH_OF_ARRAY(formats); format++)
		{
			for (int size = 0; size < DE_LENGTH_OF_ARRAY(tex2DSizes); size++)
			{
				for (int hint = 0; hint < DE_LENGTH_OF_ARRAY(genHints); hint++)
				{
					std::ostringstream name;
					name << formats[format].name;

					if (tex2DSizes[size].name)
						name << "_" << tex2DSizes[size].name;

					name << "_" << genHints[hint].name;

					genMipmapGroup->addChild(new Texture2DGenMipmapCase(m_testCtx, m_context.getRenderContext(), name.str().c_str(), "",
																		formats[format].format, formats[format].dataType, genHints[hint].hint,
																		tex2DSizes[size].width, tex2DSizes[size].height));
				}
			}
		}
	}

	const int cubeMapSize = 64;

	static const struct
	{
		CoordType		type;
		const char*		name;
		const char*		desc;
	} cubeCoordTypes[] =
	{
		{ COORDTYPE_BASIC,		"basic",		"Mipmapping with translated and scaled coordinates" },
		{ COORDTYPE_PROJECTED,	"projected",	"Mipmapping with perspective projection"			},
		{ COORDTYPE_BASIC_BIAS,	"bias",			"User-supplied bias value"							}
	};

	// Cubemap cases.
	for (int coordType = 0; coordType < DE_LENGTH_OF_ARRAY(cubeCoordTypes); coordType++)
	{
		tcu::TestCaseGroup* coordTypeGroup = new tcu::TestCaseGroup(m_testCtx, cubeCoordTypes[coordType].name, cubeCoordTypes[coordType].desc);
		groupCube->addChild(coordTypeGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
		{
			coordTypeGroup->addChild(new TextureCubeMipmapCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(),
															   minFilterModes[minFilter].name, "",
															   cubeCoordTypes[coordType].type,
															   minFilterModes[minFilter].mode,
															   GL_CLAMP_TO_EDGE,
															   GL_CLAMP_TO_EDGE,
															   GL_RGBA, GL_UNSIGNED_BYTE, cubeMapSize));
		}
	}

	// Cubemap mipmap generation variants.
	{
		tcu::TestCaseGroup* genMipmapGroup = new tcu::TestCaseGroup(m_testCtx, "generate", "Mipmap generation tests");
		groupCube->addChild(genMipmapGroup);

		for (int format = 0; format < DE_LENGTH_OF_ARRAY(formats); format++)
		{
			for (int hint = 0; hint < DE_LENGTH_OF_ARRAY(genHints); hint++)
			{
				std::ostringstream name;
				name << formats[format].name
					 << "_" << genHints[hint].name;

				genMipmapGroup->addChild(new TextureCubeGenMipmapCase(m_testCtx, m_context.getRenderContext(), name.str().c_str(), "", formats[format].format, formats[format].dataType, genHints[hint].hint, cubeMapSize));
			}
		}
	}
}